

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromDataReader::load(ModelBinFromDataReader *this,int w,int type)

{
  long *plVar1;
  int *piVar2;
  void *__dest;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  byte *pbVar6;
  long lVar7;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  size_t nread_2;
  size_t nread_1;
  void *refbuf_4;
  void *refbuf_3;
  int i;
  float *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  size_t align_weight_data_size;
  float quantization_value [256];
  void *refbuf_2;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  void *refbuf_1;
  size_t align_data_size_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  void *refbuf;
  size_t align_data_size;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  size_t nread;
  Mat m;
  Allocator *in_stack_ffffffffffffefe8;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffeff0;
  size_type in_stack_ffffffffffffeff8;
  Mat *in_stack_fffffffffffff000;
  undefined8 in_stack_fffffffffffff038;
  int iVar8;
  undefined7 in_stack_fffffffffffff040;
  undefined1 in_stack_fffffffffffff047;
  bool local_f31;
  bool local_e99;
  bool local_e41;
  bool local_dd1;
  void *local_cc0;
  int *local_cb8;
  undefined8 local_cb0;
  undefined4 local_ca8;
  long *local_ca0;
  undefined4 local_c98;
  int local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  long local_c80;
  long local_c78;
  void *local_c70;
  void *local_c68;
  int *local_c60;
  undefined8 local_c58;
  undefined4 local_c50;
  long *local_c48;
  undefined4 local_c40;
  int local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  long local_c28;
  void *local_c20;
  int local_c14;
  void *local_c10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c08;
  ulong local_bf0;
  undefined4 local_be8 [258];
  void *local_7e0;
  int *local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  long *local_7c0;
  undefined4 local_7b8;
  int local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  long local_7a0;
  void *local_798;
  vector<signed_char,_std::allocator<signed_char>_> local_790;
  void *local_778;
  int *local_770;
  undefined8 local_768;
  undefined4 local_760;
  long *local_758;
  undefined4 local_750;
  int local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  long local_738;
  void *local_730;
  ulong local_728;
  void *local_720;
  int *local_718;
  undefined8 local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined8 local_6e0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_6d8;
  void *local_6c0;
  int *local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  undefined8 local_678;
  ulong local_670;
  int local_664;
  int local_660;
  uint local_64c;
  ulong local_648;
  void *local_640;
  int *local_638;
  void *local_630;
  int local_628;
  Allocator *local_620;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  int local_608;
  void *local_600;
  int local_5f4;
  void **local_5e0;
  void **local_5d8;
  void **local_5d0;
  void **local_5c8;
  void **local_5c0;
  void **local_5b8;
  void **local_5a8;
  void **local_598;
  void **local_588;
  void **local_578;
  void **local_568;
  void **local_558;
  void **local_548;
  void **local_538;
  void **local_528;
  void **local_518;
  void **local_508;
  void **local_4f8;
  void **local_4e8;
  void **local_4d8;
  void **local_4c8;
  void **local_4b8;
  void **local_4a8;
  undefined4 local_454;
  long local_450;
  undefined4 local_444;
  long local_440;
  undefined4 local_434;
  long local_430;
  void **local_420;
  void **local_418;
  void **local_410;
  void **local_400;
  void **local_3f8;
  void **local_3f0;
  void **local_3e0;
  void **local_3d8;
  void **local_3d0;
  void **local_3c0;
  void **local_3b8;
  void **local_3b0;
  int local_3a8;
  undefined4 local_3a4;
  void **local_3a0;
  void **local_398;
  void **local_390;
  int local_388;
  undefined4 local_384;
  void **local_380;
  void **local_378;
  void **local_370;
  undefined8 local_368;
  undefined8 local_360;
  void *local_358;
  int local_34c;
  void **local_348;
  undefined8 local_340;
  undefined8 local_338;
  void *local_330;
  int local_324;
  void **local_320;
  undefined8 local_318;
  undefined8 local_310;
  void *local_308;
  int local_2fc;
  void **local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  void *local_2e0;
  int local_2d4;
  void **local_2d0;
  void **local_2c8;
  void **local_2c0;
  void **local_2b8;
  void **local_2b0;
  void **local_2a8;
  void **local_2a0;
  void **local_298;
  void **local_290;
  void **local_288;
  int local_280;
  undefined4 local_27c;
  int local_270;
  undefined4 local_26c;
  int local_260;
  undefined4 local_25c;
  int local_250;
  undefined4 local_24c;
  int local_240;
  undefined4 local_23c;
  int local_230;
  undefined4 local_22c;
  int local_220;
  undefined4 local_21c;
  int local_210;
  undefined4 local_20c;
  int local_200;
  undefined4 local_1fc;
  int local_1f0;
  undefined4 local_1ec;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_f0;
  undefined4 local_ec;
  void **local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  void *local_80;
  void *local_70;
  void *local_60;
  void *local_50;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffff038 >> 0x20);
  local_4a8 = &local_640;
  local_640 = (void *)0x0;
  local_638 = (int *)0x0;
  local_630 = (void *)0x0;
  local_628 = 0;
  local_620 = (Allocator *)0x0;
  local_618 = 0;
  local_614 = 0;
  local_610 = 0;
  local_60c = 0;
  local_608 = 0;
  local_600 = (void *)0x0;
  local_5f4 = in_EDX;
  if (in_ECX == 0) {
    local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                          ((long *)**(undefined8 **)(in_RSI + 8),&local_64c,4);
    if (local_648 == 4) {
      local_664 = (local_64c & 0xff) + (local_64c >> 8 & 0xff) + (local_64c >> 0x10 & 0xff) +
                  (local_64c >> 0x18);
      if (local_64c == 0x1306b47) {
        local_430 = (long)local_5f4 * 2;
        local_434 = 4;
        local_670 = local_430 + 3U & 0xfffffffffffffffc;
        local_678 = 0;
        local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                              ((long *)**(undefined8 **)(in_RSI + 8),local_670,&local_678);
        if (local_648 == local_670) {
          Mat::from_float16((unsigned_short *)
                            CONCAT17(in_stack_fffffffffffff047,in_stack_fffffffffffff040),iVar8);
          local_380 = &local_6c0;
          local_378 = &local_640;
          if (&local_640 != local_380) {
            if (local_6b8 != (int *)0x0) {
              local_384 = 1;
              LOCK();
              local_388 = *local_6b8;
              *local_6b8 = *local_6b8 + 1;
              UNLOCK();
            }
            local_1d8 = &local_640;
            if (local_638 != (int *)0x0) {
              local_1dc = 0xffffffff;
              LOCK();
              local_1e0 = *local_638;
              *local_638 = *local_638 + -1;
              UNLOCK();
              if (local_1e0 == 1) {
                if (local_620 == (Allocator *)0x0) {
                  if (local_640 != (void *)0x0) {
                    free(local_640);
                  }
                }
                else {
                  (*local_620->_vptr_Allocator[3])(local_620,local_640);
                }
              }
            }
            local_630 = (void *)0x0;
            local_628 = 0;
            local_618 = 0;
            local_614 = 0;
            local_610 = 0;
            local_60c = 0;
            local_608 = 0;
            local_600 = (void *)0x0;
            local_638 = (int *)0x0;
            local_640 = *local_380;
            local_638 = (int *)local_380[1];
            local_630 = local_380[2];
            local_628 = *(int *)(local_380 + 3);
            local_620 = (Allocator *)local_380[4];
            local_618 = *(int *)(local_380 + 5);
            local_614 = *(int *)((long)local_380 + 0x2c);
            local_610 = *(int *)(local_380 + 6);
            local_60c = *(int *)((long)local_380 + 0x34);
            local_608 = *(int *)(local_380 + 7);
            local_600 = local_380[8];
          }
          local_518 = &local_6c0;
          local_370 = &local_640;
          local_a8 = local_518;
          if (local_6b8 != (int *)0x0) {
            local_ac = 0xffffffff;
            LOCK();
            local_b0 = *local_6b8;
            *local_6b8 = *local_6b8 + -1;
            UNLOCK();
            if (local_b0 == 1) {
              if (local_6a0 == (long *)0x0) {
                if (local_6c0 != (void *)0x0) {
                  free(local_6c0);
                }
              }
              else {
                (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
              }
            }
          }
          local_6c0 = (void *)0x0;
          local_6b0 = 0;
          local_6a8 = 0;
          local_698 = 0;
          local_694 = 0;
          local_690 = 0;
          local_68c = 0;
          local_688 = 0;
          local_680 = 0;
          local_6b8 = (int *)0x0;
        }
        else {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1845e2);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             (&local_6d8,0);
          local_648 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar3,local_670);
          if (local_648 == local_670) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&local_6d8,0);
            Mat::from_float16((unsigned_short *)
                              CONCAT17(in_stack_fffffffffffff047,in_stack_fffffffffffff040),iVar8);
            local_3a0 = &local_720;
            local_398 = &local_640;
            if (&local_640 != local_3a0) {
              if (local_718 != (int *)0x0) {
                local_3a4 = 1;
                LOCK();
                local_3a8 = *local_718;
                *local_718 = *local_718 + 1;
                UNLOCK();
              }
              local_1c8 = &local_640;
              if (local_638 != (int *)0x0) {
                local_1cc = 0xffffffff;
                LOCK();
                local_1d0 = *local_638;
                *local_638 = *local_638 + -1;
                UNLOCK();
                if (local_1d0 == 1) {
                  if (local_620 == (Allocator *)0x0) {
                    if (local_640 != (void *)0x0) {
                      free(local_640);
                    }
                  }
                  else {
                    (*local_620->_vptr_Allocator[3])(local_620,local_640);
                  }
                }
              }
              local_630 = (void *)0x0;
              local_628 = 0;
              local_618 = 0;
              local_614 = 0;
              local_610 = 0;
              local_60c = 0;
              local_608 = 0;
              local_600 = (void *)0x0;
              local_638 = (int *)0x0;
              local_640 = *local_3a0;
              local_638 = (int *)local_3a0[1];
              local_630 = local_3a0[2];
              local_628 = *(int *)(local_3a0 + 3);
              local_620 = (Allocator *)local_3a0[4];
              local_618 = *(int *)(local_3a0 + 5);
              local_614 = *(int *)((long)local_3a0 + 0x2c);
              local_610 = *(int *)(local_3a0 + 6);
              local_60c = *(int *)((long)local_3a0 + 0x34);
              local_608 = *(int *)(local_3a0 + 7);
              local_600 = local_3a0[8];
            }
            local_508 = &local_720;
            local_390 = &local_640;
            local_c8 = local_508;
            if (local_718 != (int *)0x0) {
              local_cc = 0xffffffff;
              LOCK();
              local_d0 = *local_718;
              *local_718 = *local_718 + -1;
              UNLOCK();
              if (local_d0 == 1) {
                if (local_700 == (long *)0x0) {
                  if (local_720 != (void *)0x0) {
                    free(local_720);
                  }
                }
                else {
                  (**(code **)(*local_700 + 0x18))(local_700,local_720);
                }
              }
            }
            local_720 = (void *)0x0;
            local_710 = 0;
            local_708 = 0;
            local_6f8 = 0;
            local_6f4 = 0;
            local_6f0 = 0;
            local_6ec = 0;
            local_6e8 = 0;
            local_6e0 = 0;
            local_718 = (int *)0x0;
            local_660 = 0;
          }
          else {
            fprintf(_stderr,"ModelBin read float16_weights failed %zd",local_648);
            fprintf(_stderr,"\n");
            in_RDI->data = (void *)0x0;
            in_RDI->refcount = (int *)0x0;
            in_RDI->elemsize = 0;
            in_RDI->elempack = 0;
            in_RDI->allocator = (Allocator *)0x0;
            in_RDI->dims = 0;
            in_RDI->w = 0;
            in_RDI->h = 0;
            in_RDI->d = 0;
            in_RDI->c = 0;
            in_RDI->cstep = 0;
            local_660 = 1;
          }
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_ffffffffffffeff0);
          if (local_660 != 0) goto LAB_00187cd4;
        }
        local_5b8 = &local_640;
        in_RDI->data = local_640;
        in_RDI->refcount = local_638;
        in_RDI->elemsize = (size_t)local_630;
        in_RDI->elempack = local_628;
        in_RDI->allocator = local_620;
        in_RDI->dims = local_618;
        in_RDI->w = local_614;
        in_RDI->h = local_610;
        in_RDI->d = local_60c;
        in_RDI->c = local_608;
        in_RDI->cstep = (size_t)local_600;
        if (in_RDI->refcount != (int *)0x0) {
          piVar2 = in_RDI->refcount;
          local_1ec = 1;
          LOCK();
          local_1f0 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_660 = 1;
      }
      else if (local_64c == 0xd4b38) {
        local_440 = (long)local_5f4;
        local_444 = 4;
        local_728 = local_440 + 3U & 0xfffffffffffffffc;
        local_730 = (void *)0x0;
        local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                              ((long *)**(undefined8 **)(in_RSI + 8),local_728,&local_730);
        if (local_648 == local_728) {
          local_348 = &local_778;
          local_34c = local_5f4;
          local_358 = local_730;
          local_360 = 1;
          local_368 = 0;
          local_778 = local_730;
          local_770 = (int *)0x0;
          local_768 = 1;
          local_760 = 1;
          local_758 = (long *)0x0;
          local_750 = 1;
          local_74c = local_5f4;
          local_748 = 1;
          local_744 = 1;
          local_740 = 1;
          local_738 = (long)local_5f4;
          local_3c0 = &local_778;
          local_3b8 = &local_640;
          if (&local_640 != local_3c0) {
            local_1b8 = &local_640;
            if (local_638 != (int *)0x0) {
              local_1bc = 0xffffffff;
              LOCK();
              local_1c0 = *local_638;
              *local_638 = *local_638 + -1;
              UNLOCK();
              if (local_1c0 == 1) {
                if (local_620 == (Allocator *)0x0) {
                  if (local_640 != (void *)0x0) {
                    free(local_640);
                  }
                }
                else {
                  (*local_620->_vptr_Allocator[3])(local_620,local_640);
                }
              }
            }
            local_630 = (void *)0x0;
            local_628 = 0;
            local_618 = 0;
            local_614 = 0;
            local_610 = 0;
            local_60c = 0;
            local_608 = 0;
            local_600 = (void *)0x0;
            local_638 = (int *)0x0;
            local_640 = *local_3c0;
            local_638 = (int *)local_3c0[1];
            local_630 = local_3c0[2];
            local_628 = *(int *)(local_3c0 + 3);
            local_620 = (Allocator *)local_3c0[4];
            local_618 = *(int *)(local_3c0 + 5);
            local_614 = *(int *)((long)local_3c0 + 0x2c);
            local_610 = *(int *)(local_3c0 + 6);
            local_60c = *(int *)((long)local_3c0 + 0x34);
            local_608 = *(int *)(local_3c0 + 7);
            local_600 = local_3c0[8];
          }
          local_4f8 = &local_778;
          local_3b0 = &local_640;
          local_e8 = local_4f8;
          if (local_770 != (int *)0x0) {
            local_ec = 0xffffffff;
            LOCK();
            local_f0 = *local_770;
            *local_770 = *local_770 + -1;
            UNLOCK();
            if (local_f0 == 1) {
              if (local_758 == (long *)0x0) {
                local_80 = local_778;
                if (local_778 != (void *)0x0) {
                  free(local_778);
                }
              }
              else {
                (**(code **)(*local_758 + 0x18))(local_758,local_778);
              }
            }
          }
          local_778 = (void *)0x0;
          local_768 = 0;
          local_760 = 0;
          local_750 = 0;
          local_74c = 0;
          local_748 = 0;
          local_744 = 0;
          local_740 = 0;
          local_738 = 0;
          local_770 = (int *)0x0;
        }
        else {
          std::vector<signed_char,_std::allocator<signed_char>_>::vector
                    ((vector<signed_char,_std::allocator<signed_char>_> *)0x1853b6);
          std::vector<signed_char,_std::allocator<signed_char>_>::resize
                    ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffff000,
                     in_stack_ffffffffffffeff8);
          iVar8 = (int)(in_stack_ffffffffffffeff8 >> 0x20);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](&local_790,0);
          local_648 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar4,local_728);
          if (local_648 == local_728) {
            Mat::create(in_stack_fffffffffffff000,iVar8,(size_t)in_stack_ffffffffffffeff0,
                        in_stack_ffffffffffffefe8);
            __dest = local_640;
            local_5c0 = &local_640;
            if (local_640 != (void *)0x0) {
              local_2a8 = local_5c0;
            }
            local_dd1 = local_640 != (void *)0x0 && (long)local_600 * (long)local_608 != 0;
            if (local_dd1) {
              pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 (&local_790,0);
              memcpy(__dest,pvVar4,(long)local_5f4);
              local_660 = 0;
            }
            else {
              local_5a8 = &local_640;
              in_RDI->data = local_640;
              in_RDI->refcount = local_638;
              in_RDI->elemsize = (size_t)local_630;
              in_RDI->elempack = local_628;
              in_RDI->allocator = local_620;
              in_RDI->dims = local_618;
              in_RDI->w = local_614;
              in_RDI->h = local_610;
              in_RDI->d = local_60c;
              in_RDI->c = local_608;
              in_RDI->cstep = (size_t)local_600;
              if (in_RDI->refcount != (int *)0x0) {
                piVar2 = in_RDI->refcount;
                local_1fc = 1;
                LOCK();
                local_200 = *piVar2;
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              local_660 = 1;
            }
          }
          else {
            fprintf(_stderr,"ModelBin read int8_weights failed %zd",local_648);
            fprintf(_stderr,"\n");
            in_RDI->data = (void *)0x0;
            in_RDI->refcount = (int *)0x0;
            in_RDI->elemsize = 0;
            in_RDI->elempack = 0;
            in_RDI->allocator = (Allocator *)0x0;
            in_RDI->dims = 0;
            in_RDI->w = 0;
            in_RDI->h = 0;
            in_RDI->d = 0;
            in_RDI->c = 0;
            in_RDI->cstep = 0;
            local_660 = 1;
          }
          std::vector<signed_char,_std::allocator<signed_char>_>::~vector(in_stack_ffffffffffffeff0)
          ;
          if (local_660 != 0) goto LAB_00187cd4;
        }
        local_598 = &local_640;
        in_RDI->data = local_640;
        in_RDI->refcount = local_638;
        in_RDI->elemsize = (size_t)local_630;
        in_RDI->elempack = local_628;
        in_RDI->allocator = local_620;
        in_RDI->dims = local_618;
        in_RDI->w = local_614;
        in_RDI->h = local_610;
        in_RDI->d = local_60c;
        in_RDI->c = local_608;
        in_RDI->cstep = (size_t)local_600;
        if (in_RDI->refcount != (int *)0x0) {
          piVar2 = in_RDI->refcount;
          local_20c = 1;
          LOCK();
          local_210 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_660 = 1;
      }
      else if (local_64c == 0x2c056) {
        local_798 = (void *)0x0;
        local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                              ((long *)**(undefined8 **)(in_RSI + 8),(long)local_5f4 << 2,&local_798
                              );
        if (local_648 == (long)local_5f4 * 4) {
          local_320 = &local_7e0;
          local_324 = local_5f4;
          local_330 = local_798;
          local_338 = 4;
          local_340 = 0;
          local_7e0 = local_798;
          local_7d8 = (int *)0x0;
          local_7d0 = 4;
          local_7c8 = 1;
          local_7c0 = (long *)0x0;
          local_7b8 = 1;
          local_7b4 = local_5f4;
          local_7b0 = 1;
          local_7ac = 1;
          local_7a8 = 1;
          local_7a0 = (long)local_5f4;
          local_3e0 = &local_7e0;
          local_3d8 = &local_640;
          if (&local_640 != local_3e0) {
            local_1a8 = &local_640;
            if (local_638 != (int *)0x0) {
              local_1ac = 0xffffffff;
              LOCK();
              local_1b0 = *local_638;
              *local_638 = *local_638 + -1;
              UNLOCK();
              if (local_1b0 == 1) {
                if (local_620 == (Allocator *)0x0) {
                  if (local_640 != (void *)0x0) {
                    free(local_640);
                  }
                }
                else {
                  (*local_620->_vptr_Allocator[3])(local_620,local_640);
                }
              }
            }
            local_630 = (void *)0x0;
            local_628 = 0;
            local_618 = 0;
            local_614 = 0;
            local_610 = 0;
            local_60c = 0;
            local_608 = 0;
            local_600 = (void *)0x0;
            local_638 = (int *)0x0;
            local_640 = *local_3e0;
            local_638 = (int *)local_3e0[1];
            local_630 = local_3e0[2];
            local_628 = *(int *)(local_3e0 + 3);
            local_620 = (Allocator *)local_3e0[4];
            local_618 = *(int *)(local_3e0 + 5);
            local_614 = *(int *)((long)local_3e0 + 0x2c);
            local_610 = *(int *)(local_3e0 + 6);
            local_60c = *(int *)((long)local_3e0 + 0x34);
            local_608 = *(int *)(local_3e0 + 7);
            local_600 = local_3e0[8];
          }
          local_4e8 = &local_7e0;
          local_3d0 = &local_640;
          local_108 = local_4e8;
          if (local_7d8 != (int *)0x0) {
            local_10c = 0xffffffff;
            LOCK();
            local_110 = *local_7d8;
            *local_7d8 = *local_7d8 + -1;
            UNLOCK();
            if (local_110 == 1) {
              if (local_7c0 == (long *)0x0) {
                local_70 = local_7e0;
                if (local_7e0 != (void *)0x0) {
                  free(local_7e0);
                }
              }
              else {
                (**(code **)(*local_7c0 + 0x18))(local_7c0,local_7e0);
              }
            }
          }
          local_7e0 = (void *)0x0;
          local_7d0 = 0;
          local_7c8 = 0;
          local_7b8 = 0;
          local_7b4 = 0;
          local_7b0 = 0;
          local_7ac = 0;
          local_7a8 = 0;
          local_7a0 = 0;
          local_7d8 = (int *)0x0;
        }
        else {
          Mat::create(in_stack_fffffffffffff000,(int)(in_stack_ffffffffffffeff8 >> 0x20),
                      (size_t)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          local_5c8 = &local_640;
          if (local_640 != (void *)0x0) {
            local_2a0 = local_5c8;
          }
          local_e41 = local_640 == (void *)0x0 || (long)local_600 * (long)local_608 == 0;
          if (local_e41) {
            local_588 = &local_640;
            in_RDI->data = local_640;
            in_RDI->refcount = local_638;
            in_RDI->elemsize = (size_t)local_630;
            in_RDI->elempack = local_628;
            in_RDI->allocator = local_620;
            in_RDI->dims = local_618;
            in_RDI->w = local_614;
            in_RDI->h = local_610;
            in_RDI->d = local_60c;
            in_RDI->c = local_608;
            in_RDI->cstep = (size_t)local_600;
            if (in_RDI->refcount != (int *)0x0) {
              piVar2 = in_RDI->refcount;
              local_21c = 1;
              LOCK();
              local_220 = *piVar2;
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            local_660 = 1;
            goto LAB_00187cd4;
          }
          local_2b8 = &local_640;
          local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                                ((long *)**(undefined8 **)(in_RSI + 8),local_640,
                                 (long)local_5f4 << 2);
          if (local_648 != (long)local_5f4 * 4) {
            fprintf(_stderr,"ModelBin read weight_data failed %zd",local_648);
            fprintf(_stderr,"\n");
            in_RDI->data = (void *)0x0;
            in_RDI->refcount = (int *)0x0;
            in_RDI->elemsize = 0;
            in_RDI->elempack = 0;
            in_RDI->allocator = (Allocator *)0x0;
            in_RDI->dims = 0;
            in_RDI->w = 0;
            in_RDI->h = 0;
            in_RDI->d = 0;
            in_RDI->c = 0;
            in_RDI->cstep = 0;
            local_660 = 1;
            goto LAB_00187cd4;
          }
        }
        local_578 = &local_640;
        in_RDI->data = local_640;
        in_RDI->refcount = local_638;
        in_RDI->elemsize = (size_t)local_630;
        in_RDI->elempack = local_628;
        in_RDI->allocator = local_620;
        in_RDI->dims = local_618;
        in_RDI->w = local_614;
        in_RDI->h = local_610;
        in_RDI->d = local_60c;
        in_RDI->c = local_608;
        in_RDI->cstep = (size_t)local_600;
        if (in_RDI->refcount != (int *)0x0) {
          piVar2 = in_RDI->refcount;
          local_22c = 1;
          LOCK();
          local_230 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_660 = 1;
      }
      else {
        if (local_664 == 0) {
          if ((char)local_64c == '\0') {
            local_c20 = (void *)0x0;
            local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                                  ((long *)**(undefined8 **)(in_RSI + 8),(long)local_5f4 << 2,
                                   &local_c20);
            if (local_648 == (long)local_5f4 * 4) {
              local_2f8 = &local_c68;
              local_2fc = local_5f4;
              local_308 = local_c20;
              local_310 = 4;
              local_318 = 0;
              local_c68 = local_c20;
              local_c60 = (int *)0x0;
              local_c58 = 4;
              local_c50 = 1;
              local_c48 = (long *)0x0;
              local_c40 = 1;
              local_c3c = local_5f4;
              local_c38 = 1;
              local_c34 = 1;
              local_c30 = 1;
              local_c28 = (long)local_5f4;
              local_400 = &local_c68;
              local_3f8 = &local_640;
              if (&local_640 != local_400) {
                local_198 = &local_640;
                if (local_638 != (int *)0x0) {
                  local_19c = 0xffffffff;
                  LOCK();
                  local_1a0 = *local_638;
                  *local_638 = *local_638 + -1;
                  UNLOCK();
                  if (local_1a0 == 1) {
                    if (local_620 == (Allocator *)0x0) {
                      if (local_640 != (void *)0x0) {
                        free(local_640);
                      }
                    }
                    else {
                      (*local_620->_vptr_Allocator[3])(local_620,local_640);
                    }
                  }
                }
                local_630 = (void *)0x0;
                local_628 = 0;
                local_618 = 0;
                local_614 = 0;
                local_610 = 0;
                local_60c = 0;
                local_608 = 0;
                local_600 = (void *)0x0;
                local_638 = (int *)0x0;
                local_640 = *local_400;
                local_638 = (int *)local_400[1];
                local_630 = local_400[2];
                local_628 = *(int *)(local_400 + 3);
                local_620 = (Allocator *)local_400[4];
                local_618 = *(int *)(local_400 + 5);
                local_614 = *(int *)((long)local_400 + 0x2c);
                local_610 = *(int *)(local_400 + 6);
                local_60c = *(int *)((long)local_400 + 0x34);
                local_608 = *(int *)(local_400 + 7);
                local_600 = local_400[8];
              }
              local_4d8 = &local_c68;
              local_3f0 = &local_640;
              local_128 = local_4d8;
              if (local_c60 != (int *)0x0) {
                local_12c = 0xffffffff;
                LOCK();
                local_130 = *local_c60;
                *local_c60 = *local_c60 + -1;
                UNLOCK();
                if (local_130 == 1) {
                  if (local_c48 == (long *)0x0) {
                    local_60 = local_c68;
                    if (local_c68 != (void *)0x0) {
                      free(local_c68);
                    }
                  }
                  else {
                    (**(code **)(*local_c48 + 0x18))(local_c48,local_c68);
                  }
                }
              }
              local_c68 = (void *)0x0;
              local_c58 = 0;
              local_c50 = 0;
              local_c40 = 0;
              local_c3c = 0;
              local_c38 = 0;
              local_c34 = 0;
              local_c30 = 0;
              local_c28 = 0;
              local_c60 = (int *)0x0;
            }
            else {
              Mat::create(in_stack_fffffffffffff000,(int)(in_stack_ffffffffffffeff8 >> 0x20),
                          (size_t)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
              local_5d8 = &local_640;
              if (local_640 != (void *)0x0) {
                local_290 = local_5d8;
              }
              local_f31 = local_640 == (void *)0x0 || (long)local_600 * (long)local_608 == 0;
              if (local_f31) {
                local_558 = &local_640;
                in_RDI->data = local_640;
                in_RDI->refcount = local_638;
                in_RDI->elemsize = (size_t)local_630;
                in_RDI->elempack = local_628;
                in_RDI->allocator = local_620;
                in_RDI->dims = local_618;
                in_RDI->w = local_614;
                in_RDI->h = local_610;
                in_RDI->d = local_60c;
                in_RDI->c = local_608;
                in_RDI->cstep = (size_t)local_600;
                if (in_RDI->refcount != (int *)0x0) {
                  piVar2 = in_RDI->refcount;
                  local_24c = 1;
                  LOCK();
                  local_250 = *piVar2;
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
                local_660 = 1;
                goto LAB_00187cd4;
              }
              local_2c0 = &local_640;
              local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                                    ((long *)**(undefined8 **)(in_RSI + 8),local_640,
                                     (long)local_5f4 << 2);
              if (local_648 != (long)local_5f4 * 4) {
                fprintf(_stderr,"ModelBin read weight_data failed %zd",local_648);
                fprintf(_stderr,"\n");
                in_RDI->data = (void *)0x0;
                in_RDI->refcount = (int *)0x0;
                in_RDI->elemsize = 0;
                in_RDI->elempack = 0;
                in_RDI->allocator = (Allocator *)0x0;
                in_RDI->dims = 0;
                in_RDI->w = 0;
                in_RDI->h = 0;
                in_RDI->d = 0;
                in_RDI->c = 0;
                in_RDI->cstep = 0;
                local_660 = 1;
                goto LAB_00187cd4;
              }
            }
          }
        }
        else {
          Mat::create(in_stack_fffffffffffff000,(int)(in_stack_ffffffffffffeff8 >> 0x20),
                      (size_t)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          local_5d0 = &local_640;
          if (local_640 != (void *)0x0) {
            local_298 = local_5d0;
          }
          local_e99 = local_640 == (void *)0x0 || (long)local_600 * (long)local_608 == 0;
          if (local_e99) {
            local_568 = &local_640;
            in_RDI->data = local_640;
            in_RDI->refcount = local_638;
            in_RDI->elemsize = (size_t)local_630;
            in_RDI->elempack = local_628;
            in_RDI->allocator = local_620;
            in_RDI->dims = local_618;
            in_RDI->w = local_614;
            in_RDI->h = local_610;
            in_RDI->d = local_60c;
            in_RDI->c = local_608;
            in_RDI->cstep = (size_t)local_600;
            if (in_RDI->refcount != (int *)0x0) {
              piVar2 = in_RDI->refcount;
              local_23c = 1;
              LOCK();
              local_240 = *piVar2;
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            local_660 = 1;
            goto LAB_00187cd4;
          }
          local_648 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                                ((long *)**(undefined8 **)(in_RSI + 8),local_be8,0x400);
          if (local_648 != 0x400) {
            fprintf(_stderr,"ModelBin read quantization_value failed %zd",local_648);
            fprintf(_stderr,"\n");
            in_RDI->data = (void *)0x0;
            in_RDI->refcount = (int *)0x0;
            in_RDI->elemsize = 0;
            in_RDI->elempack = 0;
            in_RDI->allocator = (Allocator *)0x0;
            in_RDI->dims = 0;
            in_RDI->w = 0;
            in_RDI->h = 0;
            in_RDI->d = 0;
            in_RDI->c = 0;
            in_RDI->cstep = 0;
            local_660 = 1;
            goto LAB_00187cd4;
          }
          local_450 = (long)local_5f4;
          local_454 = 4;
          local_bf0 = local_450 + 3U & 0xfffffffffffffffc;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1865fe);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
          plVar1 = (long *)**(undefined8 **)(in_RSI + 8);
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_c08,0);
          local_648 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar5,local_bf0);
          if (local_648 == local_bf0) {
            local_2b0 = &local_640;
            local_c10 = local_640;
            for (local_c14 = 0; local_c14 < local_5f4; local_c14 = local_c14 + 1) {
              pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&local_c08,(long)local_c14);
              *(undefined4 *)((long)local_c10 + (long)local_c14 * 4) = local_be8[*pbVar6];
            }
            local_660 = 0;
          }
          else {
            fprintf(_stderr,"ModelBin read index_array failed %zd",local_648);
            fprintf(_stderr,"\n");
            in_RDI->data = (void *)0x0;
            in_RDI->refcount = (int *)0x0;
            in_RDI->elemsize = 0;
            in_RDI->elempack = 0;
            in_RDI->allocator = (Allocator *)0x0;
            in_RDI->dims = 0;
            in_RDI->w = 0;
            in_RDI->h = 0;
            in_RDI->d = 0;
            in_RDI->c = 0;
            in_RDI->cstep = 0;
            local_660 = 1;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffeff0);
          if (local_660 != 0) goto LAB_00187cd4;
        }
        local_548 = &local_640;
        in_RDI->data = local_640;
        in_RDI->refcount = local_638;
        in_RDI->elemsize = (size_t)local_630;
        in_RDI->elempack = local_628;
        in_RDI->allocator = local_620;
        in_RDI->dims = local_618;
        in_RDI->w = local_614;
        in_RDI->h = local_610;
        in_RDI->d = local_60c;
        in_RDI->c = local_608;
        in_RDI->cstep = (size_t)local_600;
        if (in_RDI->refcount != (int *)0x0) {
          piVar2 = in_RDI->refcount;
          local_25c = 1;
          LOCK();
          local_260 = *piVar2;
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_660 = 1;
      }
    }
    else {
      fprintf(_stderr,"ModelBin read flag_struct failed %zd",local_648);
      fprintf(_stderr,"\n");
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
      local_660 = 1;
    }
    goto LAB_00187cd4;
  }
  if (in_ECX != 1) {
    fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)in_ECX);
    fprintf(_stderr,"\n");
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
    local_660 = 1;
    goto LAB_00187cd4;
  }
  local_c70 = (void *)0x0;
  local_c78 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x20))
                        ((long *)**(undefined8 **)(in_RSI + 8),(long)in_EDX << 2,&local_c70);
  if (local_c78 == (long)local_5f4 * 4) {
    local_2d0 = &local_cc0;
    local_2d4 = local_5f4;
    local_2e0 = local_c70;
    local_2e8 = 4;
    local_2f0 = 0;
    local_cc0 = local_c70;
    local_cb8 = (int *)0x0;
    local_cb0 = 4;
    local_ca8 = 1;
    local_ca0 = (long *)0x0;
    local_c98 = 1;
    local_c94 = local_5f4;
    local_c90 = 1;
    local_c8c = 1;
    local_c88 = 1;
    local_c80 = (long)local_5f4;
    local_420 = &local_cc0;
    local_418 = &local_640;
    if (&local_640 != local_420) {
      local_188 = &local_640;
      if (local_638 != (int *)0x0) {
        local_18c = 0xffffffff;
        LOCK();
        local_190 = *local_638;
        *local_638 = *local_638 + -1;
        UNLOCK();
        if (local_190 == 1) {
          if (local_620 == (Allocator *)0x0) {
            if (local_640 != (void *)0x0) {
              free(local_640);
            }
          }
          else {
            (*local_620->_vptr_Allocator[3])(local_620,local_640);
          }
        }
      }
      local_630 = (void *)0x0;
      local_628 = 0;
      local_618 = 0;
      local_614 = 0;
      local_610 = 0;
      local_60c = 0;
      local_608 = 0;
      local_600 = (void *)0x0;
      local_638 = (int *)0x0;
      local_640 = *local_420;
      local_638 = (int *)local_420[1];
      local_630 = local_420[2];
      local_628 = *(int *)(local_420 + 3);
      local_620 = (Allocator *)local_420[4];
      local_618 = *(int *)(local_420 + 5);
      local_614 = *(int *)((long)local_420 + 0x2c);
      local_610 = *(int *)(local_420 + 6);
      local_60c = *(int *)((long)local_420 + 0x34);
      local_608 = *(int *)(local_420 + 7);
      local_600 = local_420[8];
    }
    local_4c8 = &local_cc0;
    local_410 = &local_640;
    local_148 = local_4c8;
    if (local_cb8 != (int *)0x0) {
      local_14c = 0xffffffff;
      LOCK();
      local_150 = *local_cb8;
      *local_cb8 = *local_cb8 + -1;
      UNLOCK();
      if (local_150 == 1) {
        if (local_ca0 == (long *)0x0) {
          local_50 = local_cc0;
          if (local_cc0 != (void *)0x0) {
            free(local_cc0);
          }
        }
        else {
          (**(code **)(*local_ca0 + 0x18))(local_ca0,local_cc0);
        }
      }
    }
    local_cc0 = (void *)0x0;
    local_cb0 = 0;
    local_ca8 = 0;
    local_c98 = 0;
    local_c94 = 0;
    local_c90 = 0;
    local_c8c = 0;
    local_c88 = 0;
    local_c80 = 0;
    local_cb8 = (int *)0x0;
  }
  else {
    Mat::create(in_stack_fffffffffffff000,(int)(in_stack_ffffffffffffeff8 >> 0x20),
                (size_t)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    local_5e0 = &local_640;
    if (local_640 != (void *)0x0) {
      local_288 = local_5e0;
    }
    if (local_640 == (void *)0x0 || (long)local_600 * (long)local_608 == 0) {
      local_538 = &local_640;
      in_RDI->data = local_640;
      in_RDI->refcount = local_638;
      in_RDI->elemsize = (size_t)local_630;
      in_RDI->elempack = local_628;
      in_RDI->allocator = local_620;
      in_RDI->dims = local_618;
      in_RDI->w = local_614;
      in_RDI->h = local_610;
      in_RDI->d = local_60c;
      in_RDI->c = local_608;
      in_RDI->cstep = (size_t)local_600;
      if (in_RDI->refcount != (int *)0x0) {
        piVar2 = in_RDI->refcount;
        local_26c = 1;
        LOCK();
        local_270 = *piVar2;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      local_660 = 1;
      goto LAB_00187cd4;
    }
    local_2c8 = &local_640;
    lVar7 = (**(code **)(*(long *)**(undefined8 **)(in_RSI + 8) + 0x18))
                      ((long *)**(undefined8 **)(in_RSI + 8),local_640,(long)local_5f4 << 2);
    if (lVar7 != (long)local_5f4 * 4) {
      fprintf(_stderr,"ModelBin read weight_data failed %zd",lVar7);
      fprintf(_stderr,"\n");
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
      local_660 = 1;
      goto LAB_00187cd4;
    }
  }
  local_528 = &local_640;
  in_RDI->data = local_640;
  in_RDI->refcount = local_638;
  in_RDI->elemsize = (size_t)local_630;
  in_RDI->elempack = local_628;
  in_RDI->allocator = local_620;
  in_RDI->dims = local_618;
  in_RDI->w = local_614;
  in_RDI->h = local_610;
  in_RDI->d = local_60c;
  in_RDI->c = local_608;
  in_RDI->cstep = (size_t)local_600;
  if (in_RDI->refcount != (int *)0x0) {
    piVar2 = in_RDI->refcount;
    local_27c = 1;
    LOCK();
    local_280 = *piVar2;
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  local_660 = 1;
LAB_00187cd4:
  local_4b8 = &local_640;
  if (local_638 != (int *)0x0) {
    local_16c = 0xffffffff;
    LOCK();
    local_170 = *local_638;
    *local_638 = *local_638 + -1;
    UNLOCK();
    if (local_170 == 1) {
      local_168 = local_4b8;
      if (local_620 == (Allocator *)0x0) {
        if (local_640 != (void *)0x0) {
          free(local_640);
        }
      }
      else {
        (*local_620->_vptr_Allocator[3])(local_620,local_640);
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(&float16_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(&float16_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(&int8_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, &int8_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(&index_array[0], align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}